

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VWrmsNormMaskVectorArray(int nvec,N_Vector *X,N_Vector *W,N_Vector id,realtype *nrm)

{
  realtype rVar1;
  int local_34;
  int ier;
  int i;
  realtype *nrm_local;
  N_Vector id_local;
  N_Vector *W_local;
  N_Vector *X_local;
  int nvec_local;
  
  if (id->ops->nvwrmsnormmaskvectorarray ==
      (_func_int_int_N_Vector_ptr_N_Vector_ptr_N_Vector_realtype_ptr *)0x0) {
    for (local_34 = 0; local_34 < nvec; local_34 = local_34 + 1) {
      rVar1 = (*id->ops->nvwrmsnormmask)(X[local_34],W[local_34],id);
      nrm[local_34] = rVar1;
    }
    X_local._4_4_ = 0;
  }
  else {
    X_local._4_4_ = (*id->ops->nvwrmsnormmaskvectorarray)(nvec,X,W,id,nrm);
  }
  return X_local._4_4_;
}

Assistant:

int N_VWrmsNormMaskVectorArray(int nvec, N_Vector* X, N_Vector* W, N_Vector id,
                               realtype* nrm)
{
  int i, ier;

  if (id->ops->nvwrmsnormmaskvectorarray != NULL) {

    ier = id->ops->nvwrmsnormmaskvectorarray(nvec, X, W, id, nrm);
    return(ier);

  } else {

    for (i=0; i<nvec; i++) {
      nrm[i] = id->ops->nvwrmsnormmask(X[i], W[i], id);
    }
    return(0);

  }
}